

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_std::utf8_numpunct_from_wide::~utf8_numpunct_from_wide
          (utf8_numpunct_from_wide *this)

{
  numpunct<char> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__utf8_numpunct_from_wide_002ebdd0;
  std::__cxx11::string::~string((string *)(in_RDI + 0x60));
  std::__cxx11::string::~string((string *)(in_RDI + 0x38));
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  std::__cxx11::numpunct<char>::~numpunct(in_RDI);
  return;
}

Assistant:

utf8_numpunct_from_wide(std::locale const &base,size_t refs = 0) : std::numpunct<char>(refs)
    {
        typedef std::numpunct<wchar_t> wfacet_type;
        wfacet_type const &wfacet = std::use_facet<wfacet_type>(base);
        
        truename_ = conv::from_utf<wchar_t>(wfacet.truename(),"UTF-8");
        falsename_ = conv::from_utf<wchar_t>(wfacet.falsename(),"UTF-8");
        
        wchar_t tmp_decimal_point = wfacet.decimal_point();
        wchar_t tmp_thousands_sep = wfacet.thousands_sep();
        std::string tmp_grouping = wfacet.grouping();
        
        if( 32 <= tmp_thousands_sep && tmp_thousands_sep <=126 &&
            32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_ = static_cast<char>(tmp_thousands_sep);
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126 && tmp_thousands_sep == 0xA0) {
            // workaround common bug - substitute NBSP with ordinary space
            thousands_sep_ = ' ';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_=',';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_=std::string();
        }
        else {
            thousands_sep_ = ',';
            decimal_point_ = '.';
            grouping_=std::string();
        }
    }